

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

bool __thiscall cmGeneratorTarget::HasImplibGNUtoMS(cmGeneratorTarget *this,string *config)

{
  bool bVar1;
  bool local_56;
  allocator<char> local_41;
  string local_40;
  string *local_20;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  local_20 = config;
  config_local = (string *)this;
  bVar1 = HasImportLibrary(this,config);
  local_56 = false;
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"GNUtoMS",&local_41);
    local_56 = GetPropertyAsBool(this,&local_40);
  }
  this_local._7_1_ = local_56;
  if (bVar1) {
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmGeneratorTarget::HasImplibGNUtoMS(std::string const& config) const
{
  return this->HasImportLibrary(config) && this->GetPropertyAsBool("GNUtoMS");
}